

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O2

int uv_fs_poll_getpath(uv_fs_poll_t *handle,char *buffer,size_t *size)

{
  int iVar1;
  size_t __n;
  char *__s;
  
  iVar1 = uv_is_active((uv_handle_t *)handle);
  if (iVar1 == 0) {
    *size = 0;
    iVar1 = -0x16;
  }
  else {
    if (handle->poll_ctx == (void *)0x0) {
      __assert_fail("ctx != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/fs-poll.c"
                    ,0x94,"int uv_fs_poll_getpath(uv_fs_poll_t *, char *, size_t *)");
    }
    __s = (char *)((long)handle->poll_ctx + 800);
    __n = strlen(__s);
    if (__n < *size) {
      memcpy(buffer,__s,__n);
      *size = __n;
      buffer[__n] = '\0';
      iVar1 = 0;
    }
    else {
      *size = __n + 1;
      iVar1 = -0x69;
    }
  }
  return iVar1;
}

Assistant:

int uv_fs_poll_getpath(uv_fs_poll_t* handle, char* buffer, size_t* size) {
  struct poll_ctx* ctx;
  size_t required_len;

  if (!uv_is_active((uv_handle_t*)handle)) {
    *size = 0;
    return UV_EINVAL;
  }

  ctx = handle->poll_ctx;
  assert(ctx != NULL);

  required_len = strlen(ctx->path);
  if (required_len >= *size) {
    *size = required_len + 1;
    return UV_ENOBUFS;
  }

  memcpy(buffer, ctx->path, required_len);
  *size = required_len;
  buffer[required_len] = '\0';

  return 0;
}